

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::FormatToVulgarFraction(ON_wString *this,ON_wString *numerator,ON_wString *denominator)

{
  ON_wString OStack_48;
  ON_wString local_40;
  ON_wString local_38;
  ON_wString local_30;
  ON_wString local_28;
  ON_wString local_20;
  
  ON_wString(&local_20,numerator);
  FormatToVulgarFractionNumerator(&local_30,&local_20);
  ON_wString(&local_38,L'⁄',1);
  operator+(&local_28,&local_30);
  ON_wString(&OStack_48,denominator);
  FormatToVulgarFractionDenominator(&local_40,&OStack_48);
  operator+(this,&local_28);
  ~ON_wString(&local_40);
  ~ON_wString(&OStack_48);
  ~ON_wString(&local_28);
  ~ON_wString(&local_38);
  ~ON_wString(&local_30);
  ~ON_wString(&local_20);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FormatToVulgarFraction(
  const ON_wString numerator,
  const ON_wString denominator
)
{
  return ON_wString::FormatToVulgarFractionNumerator(numerator) + ON_wString::VulgarFractionSlash() + ON_wString::FormatToVulgarFractionDenominator(denominator);
}